

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdStream.h
# Opt level: O1

void __thiscall nv::StdInputStream::~StdInputStream(StdInputStream *this)

{
  FILE *__stream;
  
  (this->super_StdStream).super_Stream._vptr_Stream = (_func_int **)&PTR__StdStream_0024d6e8;
  __stream = (FILE *)(this->super_StdStream).m_fp;
  if ((__stream != (FILE *)0x0) && ((this->super_StdStream).m_autoclose == true)) {
    fclose(__stream);
  }
  operator_delete(this,0x20);
  return;
}

Assistant:

class NVCORE_CLASS StdInputStream : public StdStream
{
	NV_FORBID_COPY(StdInputStream);
public:

	/// Construct stream by file name.
	StdInputStream( const char * name ) : 
		StdStream(fileOpen(name, "rb")) { }

	/// Construct stream by file handle.
	StdInputStream( FILE * fp, bool autoclose=true ) : StdStream(fp, autoclose)
	{
	}

	/** @name Stream implementation. */
	//@{
		/// Read data.
		virtual uint serialize( void * data, uint len )
		{
			nvDebugCheck(data != NULL);
			nvDebugCheck(m_fp != NULL);
			return (uint)fread(data, 1, len, m_fp);
		}
		
		virtual bool isLoading() const
		{
			return true;
		}
		
		virtual bool isSaving() const
		{
			return false;
		}
	//@}
}